

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_57051::StatTestMiddle::Run(StatTestMiddle *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  Node *pNVar6;
  size_type sVar7;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  undefined4 local_fc;
  undefined1 local_f8 [8];
  string err;
  string local_d0;
  Node *local_b0;
  Node *out;
  key_type local_a0;
  allocator<char> local_79;
  key_type local_78;
  allocator<char> local_41;
  key_type local_40;
  ManifestParserOptions local_1c;
  int local_14;
  StatTestMiddle *pSStack_10;
  int fail_count;
  StatTestMiddle *this_local;
  
  pSStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_StatTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat mid\nbuild mid: cat in\n",local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in",&local_41);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&(this->super_StatTest).mtimes_,&local_40);
    *pmVar5 = 1;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"mid",&local_79);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&(this->super_StatTest).mtimes_,&local_78);
    *pmVar5 = 0;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"out",(allocator<char> *)((long)&out + 7));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&(this->super_StatTest).mtimes_,&local_a0);
    *pmVar5 = 1;
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&out + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"out",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    local_b0 = pNVar6;
    std::__cxx11::string::string((string *)local_f8);
    pTVar1 = g_current_test;
    bVar3 = Node::Stat(local_b0,&(this->super_StatTest).super_DiskInterface,(string *)local_f8);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0x149,"out->Stat(this, &err)");
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f8);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0x14a,"\"\" == err");
    pTVar1 = g_current_test;
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_StatTest).stats_);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar7 == 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                       ,0x14b,"1u == stats_.size()");
    if (bVar3) {
      DependencyScan::RecomputeDirty
                (&(this->super_StatTest).scan_,local_b0,
                 (vector<Node_*,_std::allocator<Node_*>_> *)0x0,(string *)0x0);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"in",&local_121);
      pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_120);
      bVar3 = Node::dirty(pNVar6);
      bVar3 = testing::Test::Check
                        (pTVar1,!bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                         ,0x14d,"GetNode(\"in\")->dirty()");
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
      pTVar1 = g_current_test;
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"mid",&local_149);
        pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_148);
        bVar3 = Node::dirty(pNVar6);
        bVar3 = testing::Test::Check
                          (pTVar1,bVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                           ,0x14e,"GetNode(\"mid\")->dirty()");
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
        pTVar1 = g_current_test;
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"out",&local_171);
          pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_170);
          bVar3 = Node::dirty(pNVar6);
          bVar3 = testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                             ,0x14f,"GetNode(\"out\")->dirty()");
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator(&local_171);
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            local_fc = 0;
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_fc = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_fc = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_fc = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_fc = 1;
    }
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(StatTest, Middle) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"));

  mtimes_["in"] = 1;
  mtimes_["mid"] = 0;  // missing
  mtimes_["out"] = 1;

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL, NULL);
  ASSERT_FALSE(GetNode("in")->dirty());
  ASSERT_TRUE(GetNode("mid")->dirty());
  ASSERT_TRUE(GetNode("out")->dirty());
}